

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall wasm::PrintExpressionContents::visitIf(PrintExpressionContents *this,If *curr)

{
  undefined1 auVar1 [16];
  Type TVar2;
  string_view str;
  
  str._M_str = "if";
  str._M_len = 2;
  printMedium(this->o,str);
  TVar2.id = (curr->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id;
  if (((curr->condition->type).id == 1) && (curr->ifFalse != (Expression *)0x0)) {
    TVar2 = wasm::Type::getLeastUpperBound((curr->ifTrue->type).id,(curr->ifFalse->type).id);
  }
  if (1 < TVar2.id) {
    std::operator<<(this->o,' ');
    auVar1._8_8_ = 0;
    auVar1._0_8_ = TVar2.id;
    printBlockType(this,(Signature)(auVar1 << 0x40));
    return;
  }
  return;
}

Assistant:

void visitIf(If* curr) {
    printMedium(o, "if");
    // Ifs are unreachable if their condition is unreachable, but in that case
    // the arms might have some concrete type we have to account for to produce
    // valid wat.
    auto type = curr->type;
    if (curr->condition->type == Type::unreachable && curr->ifFalse) {
      type = Type::getLeastUpperBound(curr->ifTrue->type, curr->ifFalse->type);
    }
    if (type.isConcrete()) {
      o << ' ';
      printBlockType(Signature(Type::none, type));
    }
  }